

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O3

int CheckerBigTriangle(void)

{
  int j;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  TPoint point;
  int found [3];
  TPoint pointOut [3];
  int local_60 [6];
  int local_48 [6];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar4 = 0xffffffff;
  }
  else {
    local_48[0] = -0x80000000;
    local_48[1] = -0x80000000;
    local_48[2] = 0x7fffffff;
    local_48[3] = 0x7fffffff;
    local_48[4] = 0x7fffffff;
    local_48[5] = 0x7fffffff;
    if (bigTrianglesN == 2) {
      local_48[4] = 0x7ffe7961;
      local_48[5] = 0x7fffffff;
    }
    else if (bigTrianglesN == 1) {
      local_48[4] = 0x7fffffff;
      local_48[5] = 0x7ffe7961;
    }
    local_60[4] = 0;
    local_60[2] = 0;
    local_60[3] = 0;
    iVar5 = 0;
    pcVar6 = "FAILED";
    iVar1 = 0;
    do {
      local_60[0] = 0;
      local_60[1] = 0;
      pcVar2 = ScanIntInt((FILE *)__stream,local_60,local_60 + 1);
      if (pcVar2 == "FAILED") {
        fclose(__stream);
        pcVar6 = "short output -- %s\n";
        goto LAB_00102b10;
      }
      lVar3 = 0;
      do {
        if ((local_60[0] == local_48[lVar3 * 2]) && (local_60[1] == local_48[lVar3 * 2 + 1])) {
          if (local_60[lVar3 + 2] == 1) goto LAB_00102b01;
          local_60[lVar3 + 2] = local_60[lVar3 + 2] + 1;
          iVar1 = iVar1 + 1;
          break;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    if (iVar1 == 3) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
      bigTrianglesN = bigTrianglesN + 1;
      fclose(__stream);
      if (iVar1 == 0) {
        pcVar6 = "PASSED";
      }
      puts(pcVar6);
      uVar4 = (uint)(iVar1 != 0);
    }
    else {
LAB_00102b01:
      fclose(__stream);
      pcVar6 = "wrong output -- %s\n";
LAB_00102b10:
      printf(pcVar6,"FAILED");
      uVar4 = 1;
    }
  }
  return uVar4;
}

Assistant:

static int CheckerBigTriangle(void)
{
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        return -1;
    }

    TPoint pointOut[3] =  { { INT_MIN, INT_MIN }, { INT_MAX, INT_MAX }, { INT_MAX, INT_MAX } };
    if (bigTrianglesN == 1) {
        pointOut[2].y = INT_MAX - MAX_POINT_COUNT + 2;
    }
    else if (bigTrianglesN == 2) {
        pointOut[2].x = INT_MAX - MAX_POINT_COUNT + 2;
    } 

    int found[3] = { 0 };
    int foundCount = 0;
    for (int i = 0; i < 3; ++i) {
        TPoint point = { 0, 0 };
        if (ScanPoint(out, &point) == Fail) {
            fclose(out);
            printf("short output -- %s\n", Fail);
            return 1;
        }

        for (int j = 0; j < 3; ++j) {
            if (point.x == pointOut[j].x && point.y == pointOut[j].y) {
                if (found[j] == 1) {
                    fclose(out);
                    printf("wrong output -- %s\n", Fail);
                    return 1;
                }
                
                ++found[j];
                ++foundCount;
                break;
            }
        }
    }
    
    if (foundCount != 3) {
        fclose(out);
        printf("wrong output -- %s\n", Fail);
        return 1;
    }

    int passed = !HaveGarbageAtTheEnd(out);

    ++bigTrianglesN;
    fclose(out);
    printf("%s\n", (passed) ? Pass : Fail);
    return !passed;
}